

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator=(BN *this,BN *bn)

{
  BN *bn_local;
  BN *this_local;
  
  if (this != bn) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(&this->ba,&bn->ba);
  }
  return this;
}

Assistant:

BN & BN::operator = (BN&& bn) noexcept
{
    if (this == &bn)
        return *this;
    ba = move(bn.ba);

    return *this;
}